

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUuid.cxx
# Opt level: O3

string * __thiscall
cmUuid::BinaryToString_abi_cxx11_(string *__return_storage_ptr__,cmUuid *this,uchar *input)

{
  int *piVar1;
  int *piVar2;
  _Alloc_hider this_00;
  long lVar3;
  long lVar4;
  ulong uVar5;
  long local_70;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  piVar1 = (this->Groups).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->Groups).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    local_70 = 0;
    uVar5 = 0;
    this_00._M_p = (pointer)this;
    do {
      piVar2 = piVar1;
      if (uVar5 != 0) {
        this_00._M_p = (pointer)0x2d;
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        piVar1 = (this->Groups).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar2 = piVar1 + uVar5;
      }
      lVar3 = (long)*piVar2;
      if (lVar3 != 0) {
        lVar4 = 0;
        do {
          ByteToHex_abi_cxx11_(&local_50,(cmUuid *)this_00._M_p,input[lVar4 + local_70]);
          this_00._M_p = local_50._M_dataplus._M_p;
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            this_00._M_p = (pointer)(local_50.field_2._M_allocated_capacity + 1);
            operator_delete(local_50._M_dataplus._M_p,(ulong)this_00._M_p);
          }
          lVar4 = lVar4 + 1;
        } while (lVar3 != lVar4);
        piVar1 = (this->Groups).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_70 = local_70 + lVar3;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)((long)(this->Groups).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)piVar1 >> 2));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmUuid::BinaryToString(const unsigned char* input) const
{
  std::string output;

  size_t inputIndex = 0;
  for (size_t i = 0; i < this->Groups.size(); ++i) {
    if (i != 0) {
      output += '-';
    }

    size_t bytes = this->Groups[i];
    for (size_t j = 0; j < bytes; ++j) {
      unsigned char byte = input[inputIndex++];
      output += this->ByteToHex(byte);
    }
  }

  return output;
}